

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          unsigned_long params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          unsigned_long params_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  undefined1 in_stack_ffffffffffffff58 [24];
  undefined8 in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48 [32];
  
  ::std::__cxx11::string::string((string *)&local_68,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&local_88,(string *)params);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff58,(string *)params_1);
  ::std::__cxx11::string::string(local_48,(string *)params_3);
  params_4_00._M_string_length = in_stack_ffffffffffffff58._0_8_;
  params_4_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff58._8_16_;
  params_4_00._M_dataplus._M_p = params_4._M_dataplus._M_p;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (__return_storage_ptr__,(Exception *)this,&local_68,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff58,params_2,(unsigned_long)local_48,params_4_00,
             in_stack_ffffffffffffff70);
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}